

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void ldamath::vexpdigammify_2(vw *all,float *gamma,float *norm,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  ulong uVar3;
  float *pfVar4;
  float *fp;
  undefined1 (*pauVar5) [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  
  pauVar2 = (undefined1 (*) [16])(gamma + all->lda);
  if (((ulong)gamma & 0xf) != 0 && (ulong)all->lda != 0) {
    pfVar4 = gamma + 1;
    do {
      fVar11 = *(float *)*(undefined1 (*) [16])gamma;
      fVar10 = fVar11 + 2.0;
      fVar6 = (float)((uint)fVar10 & 0x7fffff | 0x3f000000);
      auVar7._4_12_ = DAT_0027d340._4_12_;
      auVar7._0_4_ = fVar11 * 6.0 + 13.0;
      auVar13._0_4_ = fVar10 * 12.0 * fVar10;
      auVar13._4_4_ = fVar6 + 0.35208872;
      auVar13._8_8_ = 0;
      auVar7 = divps(auVar7,auVar13);
      fVar6 = ((((fVar6 * -1.4980303 + (float)(uint)fVar10 * 1.1920929e-07 + -124.22545) -
                auVar7._4_4_) * 0.6931472 +
               (-(fVar11 + fVar11 + 1.0) / ((fVar11 + 1.0) * fVar11) - auVar7._0_4_)) - *norm) *
              1.442695;
      fVar11 = -126.0;
      if (-126.0 <= fVar6) {
        fVar11 = fVar6;
      }
      fVar6 = (fVar11 - (float)(int)fVar11) + (float)(-(uint)(fVar6 < 0.0) & 0x3f800000);
      fVar6 = (float)(long)((fVar6 * -1.4901291 +
                            27.728024 / (4.8425255 - fVar6) + fVar11 + 121.274086) * 8388608.0);
      fVar11 = fVar6;
      if (fVar6 <= underflow_threshold) {
        fVar11 = underflow_threshold;
      }
      *(uint *)*(undefined1 (*) [16])gamma =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar11 |
           -(uint)NAN(underflow_threshold) & (uint)fVar6;
      gamma = (float *)((long)*(undefined1 (*) [16])gamma + 4);
      norm = norm + 1;
    } while ((gamma < pauVar2) && (uVar3 = (ulong)pfVar4 & 0xf, pfVar4 = pfVar4 + 1, uVar3 != 0));
  }
  auVar7 = _DAT_0027d480;
  pauVar1 = (undefined1 (*) [16])gamma;
  if ((undefined1 (*) [16])((long)gamma + 0x10) < pauVar2 && ((ulong)gamma & 0xf) == 0) {
    do {
      fVar11 = *(float *)*(undefined1 (*) [16])gamma;
      fVar6 = *(float *)((long)*(undefined1 (*) [16])gamma + 4);
      fVar10 = *(float *)((long)*(undefined1 (*) [16])gamma + 8);
      fVar15 = *(float *)((long)*(undefined1 (*) [16])gamma + 0xc);
      fVar21 = fVar11 + 2.0;
      fVar23 = fVar6 + 2.0;
      fVar24 = fVar10 + 2.0;
      fVar26 = fVar15 + 2.0;
      auVar16._0_4_ = (fVar11 + 1.0) * fVar11 * 12.0 * fVar21 * fVar21;
      auVar16._4_4_ = (fVar6 + 1.0) * fVar6 * 12.0 * fVar23 * fVar23;
      auVar16._8_4_ = (fVar10 + 1.0) * fVar10 * 12.0 * fVar24 * fVar24;
      auVar16._12_4_ = (fVar15 + 1.0) * fVar15 * 12.0 * fVar26 * fVar26;
      fVar19 = (float)((uint)fVar21 & 0x7fffff | 0x3f000000);
      fVar20 = (float)((uint)fVar23 & 0x7fffff | 0x3f000000);
      fVar25 = (float)((uint)fVar24 & 0x7fffff | 0x3f000000);
      fVar27 = (float)((uint)fVar26 & 0x7fffff | 0x3f000000);
      auVar22._0_4_ = fVar19 + 0.35208872;
      auVar22._4_4_ = fVar20 + 0.35208872;
      auVar22._8_4_ = fVar25 + 0.35208872;
      auVar22._12_4_ = fVar27 + 0.35208872;
      auVar18 = divps(_DAT_0027d3c0,auVar22);
      auVar12._0_4_ = ((fVar11 * -30.0 + -127.0) * fVar11 + -157.0) * fVar11 + -48.0;
      auVar12._4_4_ = ((fVar6 * -30.0 + -127.0) * fVar6 + -157.0) * fVar6 + -48.0;
      auVar12._8_4_ = ((fVar10 * -30.0 + -127.0) * fVar10 + -157.0) * fVar10 + -48.0;
      auVar12._12_4_ = ((fVar15 * -30.0 + -127.0) * fVar15 + -157.0) * fVar15 + -48.0;
      auVar13 = divps(auVar12,auVar16);
      fVar11 = ((auVar13._0_4_ +
                (auVar18._0_4_ +
                fVar19 * -1.4980303 + (float)(int)fVar21 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - *norm) * 1.442695;
      fVar6 = ((auVar13._4_4_ +
               (auVar18._4_4_ +
               fVar20 * -1.4980303 + (float)(int)fVar23 * 1.1920929e-07 + -124.22552) * 0.6931472) -
              norm[1]) * 1.442695;
      fVar10 = ((auVar13._8_4_ +
                (auVar18._8_4_ +
                fVar25 * -1.4980303 + (float)(int)fVar24 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - norm[2]) * 1.442695;
      fVar15 = ((auVar13._12_4_ +
                (auVar18._12_4_ +
                fVar27 * -1.4980303 + (float)(int)fVar26 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - norm[3]) * 1.442695;
      fVar21 = (float)(~-(uint)(fVar11 < -126.0) & (uint)(fVar11 + 0.0) |
                      -(uint)(fVar11 < -126.0) & 0xc2fc0000);
      fVar19 = (float)(~-(uint)(fVar6 < -126.0) & (uint)(fVar6 + 0.0) |
                      -(uint)(fVar6 < -126.0) & 0xc2fc0000);
      fVar23 = (float)(~-(uint)(fVar10 < -126.0) & (uint)(fVar10 + 0.0) |
                      -(uint)(fVar10 < -126.0) & 0xc2fc0000);
      fVar20 = (float)(~-(uint)(fVar15 < -126.0) & (uint)(fVar15 + 0.0) |
                      -(uint)(fVar15 < -126.0) & 0xc2fc0000);
      fVar11 = (fVar21 - (float)(int)fVar21) + (float)(-(uint)(fVar11 < 0.0) & 0x3f800000);
      fVar6 = (fVar19 - (float)(int)fVar19) + (float)(-(uint)(fVar6 < 0.0) & 0x3f800000);
      fVar10 = (fVar23 - (float)(int)fVar23) + (float)(-(uint)(fVar10 < 0.0) & 0x3f800000);
      fVar15 = (fVar20 - (float)(int)fVar20) + (float)(-(uint)(fVar15 < 0.0) & 0x3f800000);
      auVar18._0_4_ = 4.8425255 - fVar11;
      auVar18._4_4_ = 4.8425255 - fVar6;
      auVar18._8_4_ = 4.8425255 - fVar10;
      auVar18._12_4_ = 4.8425255 - fVar15;
      auVar13 = divps(auVar7,auVar18);
      auVar14._0_4_ = (int)((fVar11 * -1.4901291 + auVar13._0_4_ + fVar21 + 121.274086) * 8388608.0)
      ;
      auVar14._4_4_ = (int)((fVar6 * -1.4901291 + auVar13._4_4_ + fVar19 + 121.274086) * 8388608.0);
      auVar14._8_4_ = (int)((fVar10 * -1.4901291 + auVar13._8_4_ + fVar23 + 121.274086) * 8388608.0)
      ;
      auVar14._12_4_ =
           (int)((fVar15 * -1.4901291 + auVar13._12_4_ + fVar20 + 121.274086) * 8388608.0);
      auVar17._4_4_ = underflow_threshold;
      auVar17._0_4_ = underflow_threshold;
      auVar17._8_4_ = underflow_threshold;
      auVar17._12_4_ = underflow_threshold;
      auVar13 = maxps(auVar17,auVar14);
      *(undefined1 (*) [16])gamma = auVar13;
      norm = norm + 4;
      pauVar1 = (undefined1 (*) [16])((long)gamma + 0x10);
      pauVar5 = (undefined1 (*) [16])((long)gamma + 0x20);
      gamma = (float *)pauVar1;
    } while (pauVar5 < pauVar2);
  }
  for (; pauVar1 < pauVar2; pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + 4)) {
    fVar11 = *(float *)*pauVar1;
    fVar10 = fVar11 + 2.0;
    fVar6 = (float)((uint)fVar10 & 0x7fffff | 0x3f000000);
    auVar8._4_12_ = DAT_0027d340._4_12_;
    auVar8._0_4_ = fVar11 * 6.0 + 13.0;
    auVar9._0_4_ = fVar10 * 12.0 * fVar10;
    auVar9._4_4_ = fVar6 + 0.35208872;
    auVar9._8_8_ = 0;
    auVar7 = divps(auVar8,auVar9);
    fVar6 = ((((fVar6 * -1.4980303 + (float)(uint)fVar10 * 1.1920929e-07 + -124.22545) -
              auVar7._4_4_) * 0.6931472 +
             (-(fVar11 + fVar11 + 1.0) / ((fVar11 + 1.0) * fVar11) - auVar7._0_4_)) - *norm) *
            1.442695;
    fVar11 = -126.0;
    if (-126.0 <= fVar6) {
      fVar11 = fVar6;
    }
    fVar6 = (fVar11 - (float)(int)fVar11) + (float)(-(uint)(fVar6 < 0.0) & 0x3f800000);
    fVar6 = (float)(long)((fVar6 * -1.4901291 +
                          27.728024 / (4.8425255 - fVar6) + fVar11 + 121.274086) * 8388608.0);
    fVar11 = fVar6;
    if (fVar6 <= underflow_threshold) {
      fVar11 = underflow_threshold;
    }
    *(uint *)*pauVar1 =
         ~-(uint)NAN(underflow_threshold) & (uint)fVar11 |
         -(uint)NAN(underflow_threshold) & (uint)fVar6;
    norm = norm + 1;
  }
  return;
}

Assistant:

void vexpdigammify_2(vw &all, float *gamma, const float *norm, const float underflow_threshold)
{
  float *fp = gamma;
  const float *np;
  const float *fpend = gamma + all.lda;

  for (np = norm; fp < fpend && !is_aligned16(fp); ++fp, ++np)
    *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4, np += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = vfastdigamma(arg);
    v4sf vnorm = _mm_loadu_ps(np);
    arg = arg - vnorm;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp, ++np) *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));
}